

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_image.h
# Opt level: O0

void __thiscall TextureImage::Texture::clear(Texture *this)

{
  string local_50 [32];
  string local_30 [32];
  Texture *local_10;
  Texture *this_local;
  
  this->available = false;
  local_10 = this;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::operator=((string *)&this->name,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::string(local_50);
  std::__cxx11::string::operator=((string *)&this->filename,local_50);
  std::__cxx11::string::~string(local_50);
  glDeleteTextures(1,&this->tex);
  this->tex = 0;
  return;
}

Assistant:

void clear() {
            available = false;
            name = std::string();
            filename = std::string();
            glDeleteTextures(1, &tex);
            tex = 0;
        }